

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

matches * atomendmark(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  matches *pmVar1;
  
  if (ctx->reverse != 0) {
    pmVar1 = alwaysmatches(spos);
    return pmVar1;
  }
  ctx->endmark = 1;
  return (matches *)0x0;
}

Assistant:

struct matches *atomendmark APROTO {
	if (!ctx->reverse) {
		ctx->endmark = 1;
		return NULL;
	} else {
		struct matches *res = alwaysmatches(spos);
		return res;
	}
}